

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printdfd.c
# Opt level: O0

char * dfdToStringColorModel(khr_df_model_e value)

{
  khr_df_model_e value_local;
  char *local_8;
  
  switch(value) {
  case KHR_DF_MODEL_UNSPECIFIED:
    local_8 = "KHR_DF_MODEL_UNSPECIFIED";
    break;
  case KHR_DF_MODEL_RGBSDA:
    local_8 = "KHR_DF_MODEL_RGBSDA";
    break;
  case KHR_DF_MODEL_YUVSDA:
    local_8 = "KHR_DF_MODEL_YUVSDA";
    break;
  case KHR_DF_MODEL_YIQSDA:
    local_8 = "KHR_DF_MODEL_YIQSDA";
    break;
  case KHR_DF_MODEL_LABSDA:
    local_8 = "KHR_DF_MODEL_LABSDA";
    break;
  case KHR_DF_MODEL_CMYKA:
    local_8 = "KHR_DF_MODEL_CMYKA";
    break;
  case KHR_DF_MODEL_XYZW:
    local_8 = "KHR_DF_MODEL_XYZW";
    break;
  case KHR_DF_MODEL_HSVA_ANG:
    local_8 = "KHR_DF_MODEL_HSVA_ANG";
    break;
  case KHR_DF_MODEL_HSLA_ANG:
    local_8 = "KHR_DF_MODEL_HSLA_ANG";
    break;
  case KHR_DF_MODEL_HSVA_HEX:
    local_8 = "KHR_DF_MODEL_HSVA_HEX";
    break;
  case KHR_DF_MODEL_HSLA_HEX:
    local_8 = "KHR_DF_MODEL_HSLA_HEX";
    break;
  case KHR_DF_MODEL_YCGCOA:
    local_8 = "KHR_DF_MODEL_YCGCOA";
    break;
  case KHR_DF_MODEL_YCCBCCRC:
    local_8 = "KHR_DF_MODEL_YCCBCCRC";
    break;
  case KHR_DF_MODEL_ICTCP:
    local_8 = "KHR_DF_MODEL_ICTCP";
    break;
  case KHR_DF_MODEL_CIEXYZ:
    local_8 = "KHR_DF_MODEL_CIEXYZ";
    break;
  case KHR_DF_MODEL_CIEXYY:
    local_8 = "KHR_DF_MODEL_CIEXYY";
    break;
  case KHR_DF_MODEL_BC1A:
    local_8 = "KHR_DF_MODEL_BC1A";
    break;
  case KHR_DF_MODEL_BC2:
    local_8 = "KHR_DF_MODEL_BC2";
    break;
  case KHR_DF_MODEL_BC3:
    local_8 = "KHR_DF_MODEL_BC3";
    break;
  case KHR_DF_MODEL_ATI1N:
    local_8 = "KHR_DF_MODEL_BC4";
    break;
  case KHR_DF_MODEL_ATI2N_XY:
    local_8 = "KHR_DF_MODEL_BC5";
    break;
  case KHR_DF_MODEL_BC6H:
    local_8 = "KHR_DF_MODEL_BC6H";
    break;
  case KHR_DF_MODEL_BC7:
    local_8 = "KHR_DF_MODEL_BC7";
    break;
  case KHR_DF_MODEL_ETC1:
    local_8 = "KHR_DF_MODEL_ETC1";
    break;
  case KHR_DF_MODEL_ETC2:
    local_8 = "KHR_DF_MODEL_ETC2";
    break;
  case KHR_DF_MODEL_ASTC:
    local_8 = "KHR_DF_MODEL_ASTC";
    break;
  case KHR_DF_MODEL_ETC1S:
    local_8 = "KHR_DF_MODEL_ETC1S";
    break;
  case KHR_DF_MODEL_PVRTC:
    local_8 = "KHR_DF_MODEL_PVRTC";
    break;
  case KHR_DF_MODEL_PVRTC2:
    local_8 = "KHR_DF_MODEL_PVRTC2";
    break;
  case KHR_DF_MODEL_UASTC:
    local_8 = "KHR_DF_MODEL_UASTC";
    break;
  case KHR_DF_MODEL_MAX:
  default:
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* dfdToStringColorModel(khr_df_model_e value) {
    switch (value) {
    case KHR_DF_MODEL_UNSPECIFIED:
        return "KHR_DF_MODEL_UNSPECIFIED";
    case KHR_DF_MODEL_RGBSDA:
        return "KHR_DF_MODEL_RGBSDA";
    case KHR_DF_MODEL_YUVSDA:
        return "KHR_DF_MODEL_YUVSDA";
    case KHR_DF_MODEL_YIQSDA:
        return "KHR_DF_MODEL_YIQSDA";
    case KHR_DF_MODEL_LABSDA:
        return "KHR_DF_MODEL_LABSDA";
    case KHR_DF_MODEL_CMYKA:
        return "KHR_DF_MODEL_CMYKA";
    case KHR_DF_MODEL_XYZW:
        return "KHR_DF_MODEL_XYZW";
    case KHR_DF_MODEL_HSVA_ANG:
        return "KHR_DF_MODEL_HSVA_ANG";
    case KHR_DF_MODEL_HSLA_ANG:
        return "KHR_DF_MODEL_HSLA_ANG";
    case KHR_DF_MODEL_HSVA_HEX:
        return "KHR_DF_MODEL_HSVA_HEX";
    case KHR_DF_MODEL_HSLA_HEX:
        return "KHR_DF_MODEL_HSLA_HEX";
    case KHR_DF_MODEL_YCGCOA:
        return "KHR_DF_MODEL_YCGCOA";
    case KHR_DF_MODEL_YCCBCCRC:
        return "KHR_DF_MODEL_YCCBCCRC";
    case KHR_DF_MODEL_ICTCP:
        return "KHR_DF_MODEL_ICTCP";
    case KHR_DF_MODEL_CIEXYZ:
        return "KHR_DF_MODEL_CIEXYZ";
    case KHR_DF_MODEL_CIEXYY:
        return "KHR_DF_MODEL_CIEXYY";
    case KHR_DF_MODEL_BC1A:
    // case KHR_DF_MODEL_DXT1A: // Fallthrough, Matching values
        return "KHR_DF_MODEL_BC1A";
    case KHR_DF_MODEL_BC2:
    // case KHR_DF_MODEL_DXT2: // Fallthrough, Matching values
    // case KHR_DF_MODEL_DXT3: // Fallthrough, Matching values
        return "KHR_DF_MODEL_BC2";
    case KHR_DF_MODEL_BC3:
    // case KHR_DF_MODEL_DXT4: // Fallthrough, Matching values
    // case KHR_DF_MODEL_DXT5: // Fallthrough, Matching values
        return "KHR_DF_MODEL_BC3";
    case KHR_DF_MODEL_BC4:
        return "KHR_DF_MODEL_BC4";
    case KHR_DF_MODEL_BC5:
        return "KHR_DF_MODEL_BC5";
    case KHR_DF_MODEL_BC6H:
        return "KHR_DF_MODEL_BC6H";
    case KHR_DF_MODEL_BC7:
        return "KHR_DF_MODEL_BC7";
    case KHR_DF_MODEL_ETC1:
        return "KHR_DF_MODEL_ETC1";
    case KHR_DF_MODEL_ETC2:
        return "KHR_DF_MODEL_ETC2";
    case KHR_DF_MODEL_ASTC:
        return "KHR_DF_MODEL_ASTC";
    case KHR_DF_MODEL_ETC1S:
        return "KHR_DF_MODEL_ETC1S";
    case KHR_DF_MODEL_PVRTC:
        return "KHR_DF_MODEL_PVRTC";
    case KHR_DF_MODEL_PVRTC2:
        return "KHR_DF_MODEL_PVRTC2";
    case KHR_DF_MODEL_UASTC:
        return "KHR_DF_MODEL_UASTC";

    case KHR_DF_MODEL_MAX:
        // These enum values are not meant for string representation. Ignore
        break;
    }
    return NULL;
}